

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createNoResultOp(Builder *this,Op opCode,Vector<Id> *operands)

{
  Block *this_00;
  bool bVar1;
  Instruction *this_01;
  reference puVar2;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_48;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_40;
  const_iterator it;
  Instruction *op;
  Vector<Id> *operands_local;
  Op opCode_local;
  Builder *this_local;
  
  this_01 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,opCode));
  Instruction::Instruction(this_01,opCode);
  local_40._M_current =
       (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cbegin
                         (operands);
  while( true ) {
    local_48._M_current =
         (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cend
                           (operands);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
             ::operator*(&local_40);
    Instruction::addIdOperand(this_01,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
    ::operator++(&local_40);
  }
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_50,this_01
            );
  Block::addInstruction(this_00,&local_50);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_50);
  return;
}

Assistant:

void Builder::createNoResultOp(Op opCode, const dxil_spv::Vector<Id>& operands)
{
    Instruction* op = new Instruction(opCode);
    for (auto it = operands.cbegin(); it != operands.cend(); ++it)
        op->addIdOperand(*it);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));
}